

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

Norm2AllModes * icu_63::Norm2AllModes::createInstance(Normalizer2Impl *impl,UErrorCode *errorCode)

{
  Norm2AllModes *this;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (Norm2AllModes *)UMemory::operator_new((UMemory *)0x58,(size_t)errorCode);
    if (this != (Norm2AllModes *)0x0) {
      Norm2AllModes(this,impl);
      return this;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  if (impl != (Normalizer2Impl *)0x0) {
    (*(impl->super_UObject)._vptr_UObject[1])(impl);
  }
  return (Norm2AllModes *)0x0;
}

Assistant:

Norm2AllModes *
Norm2AllModes::createInstance(Normalizer2Impl *impl, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        delete impl;
        return NULL;
    }
    Norm2AllModes *allModes=new Norm2AllModes(impl);
    if(allModes==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        delete impl;
        return NULL;
    }
    return allModes;
}